

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servak.cpp
# Opt level: O2

void __thiscall session::run(session *this)

{
  element_type *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  executor_type local_68;
  bind_front_wrapper<void_(session::*)(),_std::shared_ptr<session>_> local_38;
  
  boost::beast::
  basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>
  ::get_executor(&local_68,&this->stream_);
  std::__shared_ptr<session,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<session,void>
            ((__shared_ptr<session,(__gnu_cxx::_Lock_policy)2> *)&local_78,
             (__weak_ptr<session,_(__gnu_cxx::_Lock_policy)2> *)this);
  local_38.h_ = (offset_in_session_to_subr)do_read;
  local_38._8_8_ = 0;
  local_38.args_.
  super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<session>_>.
  super_tuple_element_impl<0UL,_std::shared_ptr<session>_>.t.
  super___shared_ptr<session,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_78;
  local_38.args_.
  super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<session>_>.
  super_tuple_element_impl<0UL,_std::shared_ptr<session>_>.t.
  super___shared_ptr<session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Stack_70._M_pi;
  local_78 = (element_type *)0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  boost::asio::
  dispatch<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::detail::bind_front_wrapper<void(session::*)(),std::shared_ptr<session>>>
            (&local_68,&local_38,(type *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&local_38.args_.
                     super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<session>_>
                     .super_tuple_element_impl<0UL,_std::shared_ptr<session>_>.t.
                     super___shared_ptr<session,_(__gnu_cxx::_Lock_policy)2> + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_70);
  boost::asio::execution::detail::any_executor_base::~any_executor_base
            (&local_68.super_any_executor_base);
  return;
}

Assistant:

void
    run()
    {
        // We need to be executing within a strand to perform async operations
        // on the I/O objects in this session. Although not strictly necessary
        // for single-threaded contexts, this example code is written to be
        // thread-safe by default.
        net::dispatch(stream_.get_executor(),
                      beast::bind_front_handler(
                          &session::do_read,
                          shared_from_this()));
    }